

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
               (TSTNode<unsigned_int> *node,size_t depth)

{
  byte bVar1;
  char cVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  undefined1 extraout_AL;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  DI __d;
  char local_49;
  TSTNode<unsigned_int> *local_48;
  DI local_40;
  size_t local_38;
  
  uVar10 = node->pivot;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_tst",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() pivot=",9);
  local_48 = node;
  if (uVar10 == 0) {
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,node->pivot);
  }
  else {
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," depth=",7);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_40.i._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_40,1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_38 = depth;
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    plVar3 = (long *)(local_48->buckets)._M_elems[0];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar11 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
      if (lVar4 != lVar9) {
        lVar9 = 0;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) goto LAB_00216aff;
          if (*(byte *)(lVar4 + depth) == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)*(byte *)(lVar4 + depth) << 0x18;
            bVar1 = *(byte *)(lVar4 + 1 + depth);
            if (bVar1 != 0) {
              uVar10 = uVar10 | (uint)bVar1 << 0x10;
              cVar2 = *(char *)(lVar4 + 2 + depth);
              if (cVar2 != '\0') {
                uVar10 = uVar10 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
              }
            }
          }
          uVar6 = local_48->pivot;
          if (uVar6 <= uVar10) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
            uVar6 = local_48->pivot;
            depth = local_38;
          }
          if (uVar6 <= uVar10) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
              ((TSTNode<unsigned_int> *)(local_48->buckets)._M_elems[0],depth);
  }
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    plVar3 = (long *)(local_48->buckets)._M_elems[1];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar11 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
      if (lVar4 != lVar9) {
        lVar9 = 0;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) goto LAB_00216aff;
          if (*(byte *)(lVar4 + depth) == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)*(byte *)(lVar4 + depth) << 0x18;
            bVar1 = *(byte *)(lVar4 + 1 + depth);
            if (bVar1 != 0) {
              uVar10 = uVar10 | (uint)bVar1 << 0x10;
              cVar2 = *(char *)(lVar4 + 2 + depth);
              if (cVar2 != '\0') {
                uVar10 = uVar10 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
              }
            }
          }
          uVar6 = uVar10;
          if (uVar10 != local_48->pivot) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
            uVar6 = local_48->pivot;
            depth = local_38;
          }
          if (uVar10 != uVar6) {
            __assert_fail("ch == node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xbd,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
              ((TSTNode<unsigned_int> *)(local_48->buckets)._M_elems[1],depth + 4);
  }
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    plVar3 = (long *)(local_48->buckets)._M_elems[2];
    if (plVar3 == (long *)0x0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    }
    else {
      lVar9 = *plVar3;
      lVar4 = plVar3[1];
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].size()=",9);
      lVar11 = lVar4 - lVar9 >> 3;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
      if (lVar4 != lVar9) {
        lVar9 = 0;
        do {
          lVar4 = *(long *)(*plVar3 + lVar9 * 8);
          if (lVar4 == 0) {
LAB_00216aff:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x38,"uint32_t get_char(unsigned char *, size_t)");
          }
          if (*(byte *)(lVar4 + depth) == 0) {
            uVar10 = 0;
LAB_002168ee:
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"INVALID: ",9);
            pcVar5 = *(char **)(*plVar3 + lVar9 * 8);
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [pivot=",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
            uVar6 = local_48->pivot;
            depth = local_38;
          }
          else {
            uVar10 = (uint)*(byte *)(lVar4 + depth) << 0x18;
            bVar1 = *(byte *)(lVar4 + 1 + depth);
            if (bVar1 != 0) {
              uVar10 = uVar10 | (uint)bVar1 << 0x10;
              cVar2 = *(char *)(lVar4 + 2 + depth);
              if (cVar2 != '\0') {
                uVar10 = uVar10 | CONCAT11(cVar2,*(undefined1 *)(lVar4 + 3 + depth));
              }
            }
            uVar6 = local_48->pivot;
            if (uVar10 <= uVar6) goto LAB_002168ee;
          }
          if (uVar10 <= uVar6) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
      }
    }
  }
  else {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() buckets[",0xb);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
              ((TSTNode<unsigned_int> *)(local_48->buckets)._M_elems[2],depth);
  }
  verify_tst<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_unsigned_int>::DI::~DI
            (&local_40);
  return (bool)extraout_AL;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}